

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O0

type __thiscall
cm::String::replace<std::basic_string_view<char,std::char_traits<char>>>
          (String *this,size_type pos,size_type count,
          basic_string_view<char,_std::char_traits<char>_> *s,size_type pos2,size_type count2)

{
  type pSVar1;
  undefined1 local_48 [8];
  string_view v;
  size_type count2_local;
  size_type pos2_local;
  basic_string_view<char,_std::char_traits<char>_> *s_local;
  size_type count_local;
  size_type pos_local;
  String *this_local;
  
  v._M_str = (char *)count2;
  _local_48 = AsStringView<std::basic_string_view<char,_std::char_traits<char>_>_>::view(s);
  _local_48 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_48,pos2,
                         (size_type)v._M_str);
  pSVar1 = replace<std::basic_string_view<char,std::char_traits<char>>&>
                     (this,pos,count,(basic_string_view<char,_std::char_traits<char>_> *)local_48);
  return pSVar1;
}

Assistant:

typename std::enable_if<AsStringView<T>::value, String&>::type replace(
    size_type pos, size_type count, T&& s, size_type pos2,
    size_type count2 = npos)
  {
    string_view v = AsStringView<T>::view(std::forward<T>(s));
    v = v.substr(pos2, count2);
    return replace(pos, count, v);
  }